

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_is_word_boundary(nk_text_edit *state,int idx)

{
  char *pcVar1;
  bool local_25;
  nk_rune local_24;
  int local_20;
  nk_rune c;
  int len;
  int idx_local;
  nk_text_edit *state_local;
  
  if (idx < 1) {
    state_local._4_4_ = 1;
  }
  else {
    c = idx;
    _len = state;
    pcVar1 = nk_str_at_rune(&state->string,idx,&local_24,&local_20);
    if (pcVar1 == (char *)0x0) {
      state_local._4_4_ = 1;
    }
    else {
      local_25 = true;
      if ((((((local_24 != 0x20) && (local_25 = true, local_24 != 9)) &&
            (local_25 = true, local_24 != 0x3000)) &&
           ((local_25 = true, local_24 != 0x2c && (local_25 = true, local_24 != 0x3b)))) &&
          ((local_25 = true, local_24 != 0x28 &&
           ((local_25 = true, local_24 != 0x29 && (local_25 = true, local_24 != 0x7b)))))) &&
         ((local_25 = true, local_24 != 0x7d &&
          ((local_25 = true, local_24 != 0x5b && (local_25 = true, local_24 != 0x5d)))))) {
        local_25 = local_24 == 0x7c;
      }
      state_local._4_4_ = (uint)local_25;
    }
  }
  return state_local._4_4_;
}

Assistant:

NK_INTERN int
nk_is_word_boundary( struct nk_text_edit *state, int idx)
{
    int len;
    nk_rune c;
    if (idx <= 0) return 1;
    if (!nk_str_at_rune(&state->string, idx, &c, &len)) return 1;
    return (c == ' ' || c == '\t' ||c == 0x3000 || c == ',' || c == ';' ||
            c == '(' || c == ')' || c == '{' || c == '}' || c == '[' || c == ']' ||
            c == '|');
}